

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Vec_Ptr_t * Ptr_AbcDeriveBoxes(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *vArray;
  Abc_Obj_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  
  vArray = Vec_PtrAllocExact(pNtk->nObjCounts[7] + pNtk->vBoxes->nSize);
  for (iVar3 = 0; iVar3 < pNtk->vBoxes->nSize; iVar3 = iVar3 + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vBoxes,iVar3);
    pVVar2 = Ptr_AbcDeriveBox(pAVar1);
    Vec_PtrPush(vArray,pVVar2);
  }
  for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar3);
    if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
      pVVar2 = Ptr_AbcDeriveNode(pAVar1);
      Vec_PtrPush(vArray,pVVar2);
    }
  }
  Ptr_CheckArray(vArray);
  return vArray;
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveBoxes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Vec_Ptr_t * vBoxes = Vec_PtrAllocExact( Abc_NtkBoxNum(pNtk) + Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Vec_PtrPush( vBoxes, Ptr_AbcDeriveBox(pObj) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        Vec_PtrPush( vBoxes, Ptr_AbcDeriveNode(pObj) );
    assert( Ptr_CheckArray(vBoxes) );
    return vBoxes;
}